

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS
ref_split_edge_ratio
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  int local_f0;
  int local_ec;
  int local_e8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL ratio;
  REF_INT e1;
  REF_INT e0;
  REF_INT cell_edge;
  REF_INT node;
  REF_INT cell_node;
  REF_INT item;
  REF_INT nodes [27];
  int local_44;
  REF_CELL pRStack_40;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    pRStack_40 = ref_grid->cell[8];
  }
  else {
    pRStack_40 = ref_grid->cell[3];
  }
  if ((node0 < 0) || (pRStack_40->ref_adj->nnode <= node0)) {
    local_e8 = -1;
  }
  else {
    local_e8 = pRStack_40->ref_adj->first[node0];
  }
  node = local_e8;
  if (local_e8 == -1) {
    local_ec = -1;
  }
  else {
    local_ec = pRStack_40->ref_adj->item[local_e8].ref;
  }
  local_44 = local_ec;
  do {
    if (node == -1) {
      *allowed = 1;
      return 0;
    }
    for (cell_edge = 0; cell_edge < pRStack_40->node_per; cell_edge = cell_edge + 1) {
      if (node1 == pRStack_40->c2n[cell_edge + pRStack_40->size_per * local_44]) {
        uVar2 = ref_cell_nodes(pRStack_40,local_44,&cell_node);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x28f,"ref_split_edge_ratio",(ulong)uVar2,"cell nodes");
          return uVar2;
        }
        for (e0 = 0; e0 < pRStack_40->node_per; e0 = e0 + 1) {
          if (node0 == (&cell_node)[e0]) {
            (&cell_node)[e0] = new_node;
          }
        }
        for (e1 = 0; e1 < pRStack_40->edge_per; e1 = e1 + 1) {
          ratio._4_4_ = (&cell_node)[pRStack_40->e2n[e1 << 1]];
          ratio._0_4_ = (&cell_node)[pRStack_40->e2n[e1 * 2 + 1]];
          if ((ratio._4_4_ == new_node) || (ratio._0_4_ == new_node)) {
            uVar2 = ref_node_ratio(ref_node_00,ratio._4_4_,ratio._0_4_,
                                   (REF_DBL *)&ref_private_macro_code_rss_1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x298,"ref_split_edge_ratio",(ulong)uVar2,"ratio node0");
              return uVar2;
            }
            if ((_ref_private_macro_code_rss_1 < ref_grid->adapt->post_min_ratio) ||
               (pRVar1 = &ref_grid->adapt->post_max_ratio,
               *pRVar1 <= _ref_private_macro_code_rss_1 && _ref_private_macro_code_rss_1 != *pRVar1)
               ) {
              *allowed = 0;
              return 0;
            }
          }
        }
        for (e0 = 0; e0 < pRStack_40->node_per; e0 = e0 + 1) {
          if (new_node == (&cell_node)[e0]) {
            (&cell_node)[e0] = node0;
          }
        }
        for (e0 = 0; e0 < pRStack_40->node_per; e0 = e0 + 1) {
          if (node1 == (&cell_node)[e0]) {
            (&cell_node)[e0] = new_node;
          }
        }
        for (e1 = 0; e1 < pRStack_40->edge_per; e1 = e1 + 1) {
          ratio._4_4_ = (&cell_node)[pRStack_40->e2n[e1 << 1]];
          ratio._0_4_ = (&cell_node)[pRStack_40->e2n[e1 * 2 + 1]];
          if ((ratio._4_4_ == new_node) || (ratio._0_4_ == new_node)) {
            uVar2 = ref_node_ratio(ref_node_00,ratio._4_4_,ratio._0_4_,
                                   (REF_DBL *)&ref_private_macro_code_rss_1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x2ac,"ref_split_edge_ratio",(ulong)uVar2,"ratio node0");
              return uVar2;
            }
            if ((_ref_private_macro_code_rss_1 < ref_grid->adapt->post_min_ratio) ||
               (pRVar1 = &ref_grid->adapt->post_max_ratio,
               *pRVar1 <= _ref_private_macro_code_rss_1 && _ref_private_macro_code_rss_1 != *pRVar1)
               ) {
              *allowed = 0;
              return 0;
            }
          }
        }
      }
    }
    node = pRStack_40->ref_adj->item[node].next;
    if (node == -1) {
      local_f0 = -1;
    }
    else {
      local_f0 = pRStack_40->ref_adj->item[node].ref;
    }
    local_44 = local_f0;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_INT new_node,
                                        REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_INT cell_edge, e0, e1;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}